

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O0

void __thiscall
Assimp::COBImporter::ReadPolH_Ascii
          (COBImporter *this,Scene *out,LineSplitter *splitter,ChunkInfo *nfo)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  Mesh *this_00;
  __shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *peVar4;
  LineSplitter *pLVar5;
  Logger *this_02;
  vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_> *this_03;
  size_type sVar6;
  reference pvVar7;
  char *pcVar8;
  ai_real aVar9;
  bool local_1d3;
  bool local_1d2;
  bool local_1d1;
  allocator<char> local_199;
  string local_198;
  allocator<char> local_171;
  string local_170;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_121;
  string local_120;
  ulong local_100;
  size_t i;
  char *s_2;
  Face *face;
  pointer pVStack_e0;
  pointer local_d8;
  pointer pVStack_d0;
  allocator<char> local_b9;
  string local_b8;
  uint local_98;
  uint local_94;
  uint cur_2;
  uint cnt_2;
  aiVector2D *v_1;
  char *s_1;
  uint cur_1;
  uint cnt_1;
  aiVector3D *v;
  char *s;
  uint cur;
  uint cnt;
  Mesh *msh;
  shared_ptr<Assimp::COB::Mesh> local_48;
  shared_ptr<Assimp::COB::Node> local_38;
  ChunkInfo *local_28;
  ChunkInfo *nfo_local;
  LineSplitter *splitter_local;
  Scene *out_local;
  COBImporter *this_local;
  
  local_28 = nfo;
  nfo_local = (ChunkInfo *)splitter;
  splitter_local = (LineSplitter *)out;
  out_local = (Scene *)this;
  if (nfo->version < 9) {
    this_00 = (Mesh *)operator_new(0x158);
    COB::Mesh::Mesh(this_00);
    std::shared_ptr<Assimp::COB::Mesh>::shared_ptr<Assimp::COB::Mesh,void>(&local_48,this_00);
    std::shared_ptr<Assimp::COB::Node>::shared_ptr<Assimp::COB::Mesh,void>(&local_38,&local_48);
    std::
    deque<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
    ::push_back(&out->nodes,&local_38);
    std::shared_ptr<Assimp::COB::Node>::~shared_ptr(&local_38);
    std::shared_ptr<Assimp::COB::Mesh>::~shared_ptr(&local_48);
    this_01 = &std::
               deque<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
               ::back((deque<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                       *)splitter_local)->
               super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>;
    peVar4 = std::__shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>::get(this_01);
    uVar3 = local_28->parent_id;
    (peVar4->super_ChunkInfo).id = local_28->id;
    (peVar4->super_ChunkInfo).parent_id = uVar3;
    uVar3 = local_28->size;
    (peVar4->super_ChunkInfo).version = local_28->version;
    (peVar4->super_ChunkInfo).size = uVar3;
    _cur = peVar4;
    pLVar5 = LineSplitter::operator++((LineSplitter *)nfo_local);
    ReadBasicNodeInfo_Ascii(this,peVar4,pLVar5,local_28);
    while (bVar2 = LineSplitter::operator_cast_to_bool((LineSplitter *)nfo_local), bVar2) {
      bVar2 = LineSplitter::match_start((LineSplitter *)nfo_local,"World Vertices");
      if (bVar2) {
        pcVar8 = LineSplitter::operator[]((LineSplitter *)nfo_local,2);
        s._4_4_ = strtoul10(pcVar8,(char **)0x0);
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&_cur[1].type,
                   (ulong)s._4_4_);
        s._0_4_ = 0;
        while( true ) {
          local_1d1 = false;
          if ((uint)s < s._4_4_) {
            pLVar5 = LineSplitter::operator++((LineSplitter *)nfo_local);
            local_1d1 = LineSplitter::operator_cast_to_bool(pLVar5);
          }
          if (local_1d1 == false) break;
          LineSplitter::operator->[abi_cxx11_((LineSplitter *)nfo_local);
          v = (aiVector3D *)std::__cxx11::string::c_str();
          _cur_1 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                             ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                              &_cur[1].type,(ulong)(uint)s);
          SkipSpaces<char>((char **)&v);
          aVar9 = fast_atof((char **)&v);
          _cur_1->x = aVar9;
          SkipSpaces<char>((char **)&v);
          aVar9 = fast_atof((char **)&v);
          _cur_1->y = aVar9;
          SkipSpaces<char>((char **)&v);
          aVar9 = fast_atof((char **)&v);
          _cur_1->z = aVar9;
          s._0_4_ = (uint)s + 1;
        }
      }
      else {
        bVar2 = LineSplitter::match_start((LineSplitter *)nfo_local,"Texture Vertices");
        if (bVar2) {
          pcVar8 = LineSplitter::operator[]((LineSplitter *)nfo_local,2);
          s_1._4_4_ = strtoul10(pcVar8,(char **)0x0);
          std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::resize
                    ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)(_cur + 1),
                     (ulong)s_1._4_4_);
          s_1._0_4_ = 0;
          while( true ) {
            local_1d2 = false;
            if ((uint)s_1 < s_1._4_4_) {
              pLVar5 = LineSplitter::operator++((LineSplitter *)nfo_local);
              local_1d2 = LineSplitter::operator_cast_to_bool(pLVar5);
            }
            if (local_1d2 == false) break;
            LineSplitter::operator->[abi_cxx11_((LineSplitter *)nfo_local);
            v_1 = (aiVector2D *)std::__cxx11::string::c_str();
            _cur_2 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::operator[]
                               ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)
                                (_cur + 1),(ulong)(uint)s_1);
            SkipSpaces<char>((char **)&v_1);
            aVar9 = fast_atof((char **)&v_1);
            _cur_2->x = aVar9;
            SkipSpaces<char>((char **)&v_1);
            aVar9 = fast_atof((char **)&v_1);
            _cur_2->y = aVar9;
            s_1._0_4_ = (uint)s_1 + 1;
          }
        }
        else {
          bVar2 = LineSplitter::match_start((LineSplitter *)nfo_local,"Faces");
          if (bVar2) {
            pcVar8 = LineSplitter::operator[]((LineSplitter *)nfo_local,1);
            local_94 = strtoul10(pcVar8,(char **)0x0);
            std::vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_>::reserve
                      ((vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_> *)
                       &_cur[1].temp_children.
                        super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                        ._M_impl.super__Deque_impl_data._M_start,(ulong)local_94);
            local_98 = 0;
            while( true ) {
              local_1d3 = false;
              if (local_98 < local_94) {
                pLVar5 = LineSplitter::operator++((LineSplitter *)nfo_local);
                local_1d3 = LineSplitter::operator_cast_to_bool(pLVar5);
              }
              if (local_1d3 == false) break;
              bVar2 = LineSplitter::match_start((LineSplitter *)nfo_local,"Hole");
              if (bVar2) {
                this_02 = DefaultLogger::get();
                Logger::warn(this_02,"Skipping unsupported `Hole` line");
              }
              else {
                bVar2 = LineSplitter::match_start((LineSplitter *)nfo_local,"Face");
                if (!bVar2) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_b8,"Expected Face line",&local_b9);
                  ThrowException(&local_b8);
                }
                peVar4 = _cur + 1;
                local_d8 = (pointer)0x0;
                pVStack_d0 = (pointer)0x0;
                face = (Face *)0x0;
                pVStack_e0 = (pointer)0x0;
                COB::Face::Face((Face *)&face);
                std::vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_>::push_back
                          ((vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_> *)
                           &(peVar4->temp_children).
                            super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                            ._M_impl.super__Deque_impl_data._M_start,(Face *)&face);
                COB::Face::~Face((Face *)&face);
                s_2 = (char *)std::vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_>::
                              back((vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_> *)
                                   &_cur[1].temp_children.
                                    super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                                    ._M_impl.super__Deque_impl_data._M_start);
                this_03 = &((reference)s_2)->indices;
                pcVar8 = LineSplitter::operator[]((LineSplitter *)nfo_local,2);
                uVar3 = strtoul10(pcVar8,(char **)0x0);
                std::vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>::
                resize(this_03,(ulong)uVar3);
                pcVar8 = LineSplitter::operator[]((LineSplitter *)nfo_local,4);
                uVar3 = strtoul10(pcVar8,(char **)0x0);
                *(uint *)(s_2 + 4) = uVar3;
                pcVar8 = LineSplitter::operator[]((LineSplitter *)nfo_local,6);
                uVar3 = strtoul10(pcVar8,(char **)0x0);
                *(uint *)s_2 = uVar3;
                pLVar5 = LineSplitter::operator++((LineSplitter *)nfo_local);
                LineSplitter::operator->[abi_cxx11_(pLVar5);
                i = std::__cxx11::string::c_str();
                for (local_100 = 0; uVar1 = local_100,
                    sVar6 = std::
                            vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                            ::size((vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                                    *)(s_2 + 8)), uVar1 < sVar6; local_100 = local_100 + 1) {
                  bVar2 = SkipSpaces<char>((char **)&i);
                  if (!bVar2) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_120,"Expected EOL token in Face entry",&local_121);
                    ThrowException(&local_120);
                  }
                  pcVar8 = (char *)(i + 1);
                  if (*(char *)i != '<') {
                    i = (size_t)pcVar8;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_148,"Expected < token in Face entry",&local_149);
                    ThrowException(&local_148);
                  }
                  i = (size_t)pcVar8;
                  uVar3 = strtoul10(pcVar8,(char **)&i);
                  pvVar7 = std::
                           vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                           ::operator[]((vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                                         *)(s_2 + 8),local_100);
                  pvVar7->pos_idx = uVar3;
                  pcVar8 = (char *)(i + 1);
                  if (*(char *)i != ',') {
                    i = (size_t)pcVar8;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_170,"Expected , token in Face entry",&local_171);
                    ThrowException(&local_170);
                  }
                  i = (size_t)pcVar8;
                  uVar3 = strtoul10(pcVar8,(char **)&i);
                  pvVar7 = std::
                           vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                           ::operator[]((vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                                         *)(s_2 + 8),local_100);
                  pvVar7->uv_idx = uVar3;
                  if (*(char *)i != '>') {
                    i = i + 1;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_198,"Expected < token in Face entry",&local_199);
                    ThrowException(&local_198);
                  }
                  i = i + 1;
                }
              }
              local_98 = local_98 + 1;
            }
            if (local_28->version < 5) {
              return;
            }
          }
          else {
            bVar2 = LineSplitter::match_start((LineSplitter *)nfo_local,"DrawFlags");
            if (bVar2) {
              pcVar8 = LineSplitter::operator[]((LineSplitter *)nfo_local,1);
              uVar3 = strtoul10(pcVar8,(char **)0x0);
              *(uint *)&_cur[1].temp_children.
                        super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_node = uVar3;
              return;
            }
          }
        }
      }
      LineSplitter::operator++((LineSplitter *)nfo_local);
    }
  }
  else {
    UnsupportedChunk_Ascii(this,splitter,nfo,"PolH");
  }
  return;
}

Assistant:

void COBImporter::ReadPolH_Ascii(Scene& out, LineSplitter& splitter, const ChunkInfo& nfo)
{
    if(nfo.version > 8) {
        return UnsupportedChunk_Ascii(splitter,nfo,"PolH");
    }

    out.nodes.push_back(std::shared_ptr<Mesh>(new Mesh()));
    Mesh& msh = (Mesh&)(*out.nodes.back().get());
    msh = nfo;

    ReadBasicNodeInfo_Ascii(msh,++splitter,nfo);

    // the chunk has a fixed order of components, but some are not interesting of us so
    // we're just looking for keywords in arbitrary order. The end of the chunk is
    // either the last `Face` or the `DrawFlags` attribute, depending on the format ver.
    for(;splitter;++splitter) {
        if (splitter.match_start("World Vertices")) {
            const unsigned int cnt = strtoul10(splitter[2]);
            msh.vertex_positions.resize(cnt);

            for(unsigned int cur = 0;cur < cnt && ++splitter;++cur) {
                const char* s = splitter->c_str();

                aiVector3D& v = msh.vertex_positions[cur];

                SkipSpaces(&s);
                v.x = fast_atof(&s);
                SkipSpaces(&s);
                v.y = fast_atof(&s);
                SkipSpaces(&s);
                v.z = fast_atof(&s);
            }
        }
        else if (splitter.match_start("Texture Vertices")) {
            const unsigned int cnt = strtoul10(splitter[2]);
            msh.texture_coords.resize(cnt);

            for(unsigned int cur = 0;cur < cnt && ++splitter;++cur) {
                const char* s = splitter->c_str();

                aiVector2D& v = msh.texture_coords[cur];

                SkipSpaces(&s);
                v.x = fast_atof(&s);
                SkipSpaces(&s);
                v.y = fast_atof(&s);
            }
        }
        else if (splitter.match_start("Faces")) {
            const unsigned int cnt = strtoul10(splitter[1]);
            msh.faces.reserve(cnt);

            for(unsigned int cur = 0; cur < cnt && ++splitter ;++cur) {
                if (splitter.match_start("Hole")) {
                    ASSIMP_LOG_WARN( "Skipping unsupported `Hole` line" );
                    continue;
                }

                if (!splitter.match_start("Face")) {
                    ThrowException("Expected Face line");
                }

                msh.faces.push_back(Face());
                Face& face = msh.faces.back();

                face.indices.resize(strtoul10(splitter[2]));
                face.flags = strtoul10(splitter[4]);
                face.material = strtoul10(splitter[6]);

                const char* s = (++splitter)->c_str();
                for(size_t i = 0; i < face.indices.size(); ++i) {
                    if(!SkipSpaces(&s)) {
                        ThrowException("Expected EOL token in Face entry");
                    }
                    if ('<' != *s++) {
                        ThrowException("Expected < token in Face entry");
                    }
                    face.indices[i].pos_idx = strtoul10(s,&s);
                    if (',' != *s++) {
                        ThrowException("Expected , token in Face entry");
                    }
                    face.indices[i].uv_idx = strtoul10(s,&s);
                    if ('>' != *s++) {
                        ThrowException("Expected < token in Face entry");
                    }
                }
            }
            if (nfo.version <= 4) {
                break;
            }
        }
        else if (splitter.match_start("DrawFlags")) {
            msh.draw_flags = strtoul10(splitter[1]);
            break;
        }
    }
}